

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-utils.h
# Opt level: O2

double cptp_dist(Instance *instance,int32_t i,int32_t j)

{
  int iVar1;
  Vec2d *pVVar2;
  uint __line;
  char *__function;
  int32_t iVar3;
  char *__assertion;
  double dVar4;
  double dVar5;
  
  if ((i < 0) || (iVar1 = instance->num_customers, iVar1 < i)) {
    __assertion = "i >= 0 && i < instance->num_customers + 1";
    __function = "double cptp_dist(const Instance *, int32_t, int32_t)";
    __line = 0x3d;
  }
  else {
    if ((-1 < j) && (j <= iVar1)) {
      if (instance->edge_weight == (double *)0x0) {
        if (CPTP_DIST_FLOOR < instance->rounding_strat) {
          __assertion = "!\"Invalid code path!\"";
          __function = "double cptp_dist(const Instance *, int32_t, int32_t)";
          __line = 0x50;
          goto LAB_00106734;
        }
        pVVar2 = instance->positions;
        dVar4 = pVVar2[(uint)j].x - pVVar2[(uint)i].x;
        dVar5 = pVVar2[(uint)j].y - pVVar2[(uint)i].y;
        dVar4 = SQRT(dVar4 * dVar4 + dVar5 * dVar5);
        switch(instance->rounding_strat) {
        case CPTP_DIST_ROUND:
          dVar4 = round(dVar4);
          return dVar4;
        case CPTP_DIST_CEIL:
          dVar4 = ceil(dVar4);
          return dVar4;
        case CPTP_DIST_FLOOR:
          dVar4 = floor(dVar4);
          return dVar4;
        }
      }
      else {
        if (i == j) {
          __assertion = "i != j";
          __function = "int64_t sxpos(int32_t, int32_t, int32_t)";
          __line = 0x2c;
          goto LAB_00106734;
        }
        iVar3 = j;
        if ((uint)i < (uint)j) {
          iVar3 = i;
        }
        if ((uint)j < (uint)i) {
          j = i;
        }
        dVar4 = instance->edge_weight
                [(int)((j - ((uint)((iVar3 + 2) * (iVar3 + 1)) >> 1)) + (iVar1 + 1) * iVar3)];
      }
      return dVar4;
    }
    __assertion = "j >= 0 && j < instance->num_customers + 1";
    __function = "double cptp_dist(const Instance *, int32_t, int32_t)";
    __line = 0x3e;
  }
LAB_00106734:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                ,__line,__function);
}

Assistant:

static inline double cptp_dist(const Instance *instance, int32_t i, int32_t j) {
    assert(i >= 0 && i < instance->num_customers + 1);
    assert(j >= 0 && j < instance->num_customers + 1);

    if (instance->edge_weight) {
        return instance->edge_weight[sxpos(instance->num_customers + 1, i, j)];
    } else {
        double distance =
            vec2d_dist(&instance->positions[i], &instance->positions[j]);

        switch (instance->rounding_strat) {
        case CPTP_DIST_ROUND: /// Default
            return round(distance);
        case CPTP_DIST_NO_ROUND:
            return distance;
        case CPTP_DIST_CEIL:
            return ceil(distance);
        case CPTP_DIST_FLOOR:
            return floor(distance);
        default:
            assert(!"Invalid code path!");
            return INFINITY;
        }
    }
    return INFINITY;
}